

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

bool __thiscall OpenMD::MoleculeStamp::addBendStamp(MoleculeStamp *this,BendStamp *bend)

{
  pointer *pppBVar1;
  iterator __position;
  BendStamp *local_8;
  
  __position._M_current =
       (this->bendStamps_).
       super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->bendStamps_).
      super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = bend;
    std::vector<OpenMD::BendStamp*,std::allocator<OpenMD::BendStamp*>>::
    _M_realloc_insert<OpenMD::BendStamp*const&>
              ((vector<OpenMD::BendStamp*,std::allocator<OpenMD::BendStamp*>> *)&this->bendStamps_,
               __position,&local_8);
  }
  else {
    *__position._M_current = bend;
    pppBVar1 = &(this->bendStamps_).
                super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return true;
}

Assistant:

bool MoleculeStamp::addBendStamp(BendStamp* bend) {
    bendStamps_.push_back(bend);
    return true;
  }